

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O0

int secp256k1_ecmult_wnaf(int *wnaf,int len,secp256k1_scalar *a,int w)

{
  uint32_t uVar1;
  int iVar2;
  int in_ECX;
  long in_RDX;
  uint in_ESI;
  long in_RDI;
  int verify_bit;
  int word;
  int now;
  int carry;
  int sign;
  int bit;
  int last_set_bit;
  secp256k1_scalar s;
  uint in_stack_ffffffffffffff98;
  uint in_stack_ffffffffffffff9c;
  undefined2 in_stack_ffffffffffffffa0;
  undefined1 uVar3;
  undefined1 uVar4;
  uint in_stack_ffffffffffffffa4;
  int in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  uint uVar5;
  int iVar6;
  int local_48;
  int local_44;
  
  local_44 = -1;
  iVar6 = 1;
  uVar5 = 0;
  if (in_RDI == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/mzumsande[P]bitcoin/src/secp256k1/src/ecmult_impl.h"
            ,0xa9,"test condition failed: wnaf != NULL");
    abort();
  }
  uVar4 = in_ESI < 0x101;
  if (!(bool)uVar4) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/mzumsande[P]bitcoin/src/secp256k1/src/ecmult_impl.h"
            ,0xaa,"test condition failed: 0 <= len && len <= 256");
    abort();
  }
  if (in_RDX == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/mzumsande[P]bitcoin/src/secp256k1/src/ecmult_impl.h"
            ,0xab,"test condition failed: a != NULL");
    abort();
  }
  uVar3 = 1 < in_ECX && in_ECX < 0x20;
  if (1 >= in_ECX || in_ECX >= 0x20) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/mzumsande[P]bitcoin/src/secp256k1/src/ecmult_impl.h"
            ,0xac,"test condition failed: 2 <= w && w <= 31");
    abort();
  }
  for (local_48 = 0; local_48 < (int)in_ESI; local_48 = local_48 + 1) {
    *(undefined4 *)(in_RDI + (long)local_48 * 4) = 0;
  }
  uVar1 = secp256k1_scalar_get_bits_limb32
                    ((secp256k1_scalar *)
                     CONCAT44(in_stack_ffffffffffffffa4,
                              CONCAT13(uVar4,CONCAT12(uVar3,in_stack_ffffffffffffffa0))),
                     in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98);
  if (uVar1 != 0) {
    secp256k1_scalar_negate
              ((secp256k1_scalar *)CONCAT44(iVar6,uVar5),
               (secp256k1_scalar *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    iVar6 = -1;
  }
  local_48 = 0;
  while (local_48 < (int)in_ESI) {
    uVar1 = secp256k1_scalar_get_bits_limb32
                      ((secp256k1_scalar *)
                       CONCAT44(in_stack_ffffffffffffffa4,
                                CONCAT13(uVar4,CONCAT12(uVar3,in_stack_ffffffffffffffa0))),
                       in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98);
    if (uVar1 == uVar5) {
      local_48 = local_48 + 1;
    }
    else {
      iVar2 = in_ECX;
      if ((int)(in_ESI - local_48) < in_ECX) {
        iVar2 = in_ESI - local_48;
      }
      uVar1 = secp256k1_scalar_get_bits_var
                        ((secp256k1_scalar *)CONCAT44(iVar2,in_stack_ffffffffffffffa8),
                         in_stack_ffffffffffffffa4,
                         CONCAT13(uVar4,CONCAT12(uVar3,in_stack_ffffffffffffffa0)));
      in_stack_ffffffffffffffa8 = uVar1 + uVar5;
      uVar5 = in_stack_ffffffffffffffa8 >> ((byte)in_ECX - 1 & 0x1f) & 1;
      in_stack_ffffffffffffffa8 = in_stack_ffffffffffffffa8 - (uVar5 << ((byte)in_ECX & 0x1f));
      *(int *)(in_RDI + (long)local_48 * 4) = iVar6 * in_stack_ffffffffffffffa8;
      local_44 = local_48;
      local_48 = iVar2 + local_48;
    }
  }
  if (uVar5 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/mzumsande[P]bitcoin/src/secp256k1/src/ecmult_impl.h"
            ,0xd4,"test condition failed: carry == 0");
    abort();
  }
  while( true ) {
    if (0xff < local_48) {
      return local_44 + 1;
    }
    uVar1 = secp256k1_scalar_get_bits_limb32
                      ((secp256k1_scalar *)
                       CONCAT44(local_48,CONCAT13(uVar4,CONCAT12(uVar3,in_stack_ffffffffffffffa0))),
                       in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98);
    if (uVar1 != 0) break;
    local_48 = local_48 + 1;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/mzumsande[P]bitcoin/src/secp256k1/src/ecmult_impl.h"
          ,0xd7,"test condition failed: secp256k1_scalar_get_bits_limb32(&s, verify_bit, 1) == 0");
  abort();
}

Assistant:

static int secp256k1_ecmult_wnaf(int *wnaf, int len, const secp256k1_scalar *a, int w) {
    secp256k1_scalar s;
    int last_set_bit = -1;
    int bit = 0;
    int sign = 1;
    int carry = 0;

    VERIFY_CHECK(wnaf != NULL);
    VERIFY_CHECK(0 <= len && len <= 256);
    VERIFY_CHECK(a != NULL);
    VERIFY_CHECK(2 <= w && w <= 31);

    for (bit = 0; bit < len; bit++) {
        wnaf[bit] = 0;
    }

    s = *a;
    if (secp256k1_scalar_get_bits_limb32(&s, 255, 1)) {
        secp256k1_scalar_negate(&s, &s);
        sign = -1;
    }

    bit = 0;
    while (bit < len) {
        int now;
        int word;
        if (secp256k1_scalar_get_bits_limb32(&s, bit, 1) == (unsigned int)carry) {
            bit++;
            continue;
        }

        now = w;
        if (now > len - bit) {
            now = len - bit;
        }

        word = secp256k1_scalar_get_bits_var(&s, bit, now) + carry;

        carry = (word >> (w-1)) & 1;
        word -= carry << w;

        wnaf[bit] = sign * word;
        last_set_bit = bit;

        bit += now;
    }
#ifdef VERIFY
    {
        int verify_bit = bit;

        VERIFY_CHECK(carry == 0);

        while (verify_bit < 256) {
            VERIFY_CHECK(secp256k1_scalar_get_bits_limb32(&s, verify_bit, 1) == 0);
            verify_bit++;
        }
    }
#endif
    return last_set_bit + 1;
}